

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

void __thiscall Scine::Core::ModuleManager::Impl::load(Impl *this,path *libraryPath)

{
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  _Var1;
  LibraryAndModules local_30;
  
  LibraryAndModules::LibraryAndModules(&local_30,libraryPath);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,__gnu_cxx::__ops::_Iter_pred<Scine::Core::ModuleManager::Impl::load(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>>
                    (local_30.modules.
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_30.modules.
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,this);
  if (_Var1._M_current ==
      local_30.modules.
      super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::emplace_back<Scine::Core::ModuleManager::Impl::LibraryAndModules>(&this->_sources,&local_30);
  }
  std::
  vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
  ::~vector(&local_30.modules);
  if (local_30.library.super_shared_library_impl.handle_ != (native_handle_t)0x0) {
    dlclose();
  }
  return;
}

Assistant:

void load(const boost::filesystem::path& libraryPath) {
    LibraryAndModules lib{libraryPath};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }